

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerImpl::Connect
          (Error *__return_storage_ptr__,CommissionerImpl *this,string *param_1,uint16_t param_2)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_48;
  undefined1 local_28 [24];
  
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_48,(v10 *)(anon_var_dwarf_66ec33 + 9),(string_view)ZEXT816(0),args);
  __return_storage_ptr__->mCode = kUnimplemented;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->mMessage,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Connect(const std::string &, uint16_t) override { return ERROR_UNIMPLEMENTED(""); }